

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_dosettracing(_glist *x,int onoff)

{
  _glist *x_00;
  t_object *ob;
  
  for (x_00 = (_glist *)x->gl_list; x_00 != (_glist *)0x0;
      x_00 = (_glist *)(x_00->gl_obj).te_g.g_next) {
    if ((x_00->gl_obj).te_g.g_pd == canvas_class) {
      canvas_dosettracing(x_00,onoff);
    }
    ob = pd_checkobject((t_pd *)x_00);
    if (ob != (t_object *)0x0) {
      obj_dosettracing(ob,onoff);
    }
  }
  return;
}

Assistant:

static void canvas_dosettracing(t_canvas *x, int onoff)
{
    t_gobj *y;
    for (y = x->gl_list; y; y = y->g_next)
    {
        t_object *ob;
        if (pd_class(&y->g_pd) == canvas_class)
            canvas_dosettracing((t_canvas *)y, onoff);
        if ((ob = pd_checkobject(&y->g_pd)))
            obj_dosettracing(ob, onoff);
    }
}